

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

int64_t __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::ConnectIndex
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,int con)

{
  ostream *poVar1;
  
  if (6 < (uint)con) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZCompElHDiv::ConnectIndex wrong parameter connect ",0x34);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,con);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," NConnects ",0xb);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x156);
  }
  return (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)con];
}

Assistant:

int64_t TPZCompElHDiv<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
	if(con<0 || con > TSHAPE::NFacets) {
		std::cout << "TPZCompElHDiv::ConnectIndex wrong parameter connect " << con <<
		" NConnects " << TSHAPE::NFacets << std::endl;
		DebugStop();
		return -1;
	}

#endif

	return this->fConnectIndexes[con];
}